

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ColumnSetColl(sqlite3 *db,Column *pCol,char *zColl)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  
  pcVar5 = pCol->zCnName;
  iVar2 = sqlite3Strlen30(pcVar5);
  uVar6 = (ulong)(iVar2 + 1);
  if ((pCol->colFlags & 4) != 0) {
    iVar3 = sqlite3Strlen30(pcVar5 + uVar6);
    uVar6 = (ulong)(iVar3 + iVar2 + 2);
  }
  uVar4 = sqlite3Strlen30(zColl);
  pcVar5 = (char *)sqlite3DbRealloc(db,pcVar5,uVar6 + uVar4 + 1);
  if (pcVar5 != (char *)0x0) {
    pCol->zCnName = pcVar5;
    memcpy(pcVar5 + uVar6,zColl,(ulong)uVar4 + 1);
    pbVar1 = (byte *)((long)&pCol->colFlags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnSetColl(
  sqlite3 *db,
  Column *pCol,
  const char *zColl
){
  i64 nColl;
  i64 n;
  char *zNew;
  assert( zColl!=0 );
  n = sqlite3Strlen30(pCol->zCnName) + 1;
  if( pCol->colFlags & COLFLAG_HASTYPE ){
    n += sqlite3Strlen30(pCol->zCnName+n) + 1;
  }
  nColl = sqlite3Strlen30(zColl) + 1;
  zNew = sqlite3DbRealloc(db, pCol->zCnName, nColl+n);
  if( zNew ){
    pCol->zCnName = zNew;
    memcpy(pCol->zCnName + n, zColl, nColl);
    pCol->colFlags |= COLFLAG_HASCOLL;
  }
}